

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

bool __thiscall duckdb::ART::MergeIndexes(ART *this,IndexLock *state,BoundIndex *other_index)

{
  BoundIndex *this_00;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *this_01;
  _Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
  this_02;
  ulong uVar1;
  bool bVar2;
  type paVar3;
  long lVar4;
  unsafe_vector<idx_t> upper_bounds;
  unsafe_vector<idx_t> local_48;
  
  bVar2 = true;
  if (*(char *)((long)&other_index[1].super_Index._vptr_Index + 7) != '\0') {
    this_00 = other_index + 1;
    if (*(char *)&other_index[1].super_Index.column_ids.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == '\x01') {
      if (0xffffffffffffff < (this->tree).super_IndexPointer.data) {
        local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        InitializeMerge(this,&local_48);
        Node::InitMerge((Node *)this_00,(ART *)other_index,&local_48);
        if (local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      this_01 = &this->allocators;
      shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
      ::operator->(this_01);
      lVar4 = 0;
      do {
        paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                 ::operator*(this_01);
        this_02.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl =
             paVar3->_M_elems[lVar4].
             super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
             .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>;
        paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                 ::operator*((shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                              *)&other_index[1].super_Index.column_ids);
        FixedSizeAllocator::Merge
                  ((FixedSizeAllocator *)
                   this_02.super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,
                   (FixedSizeAllocator *)
                   paVar3->_M_elems[lVar4].
                   super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                   .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>);
        lVar4 = lVar4 + 1;
        shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
        ::operator->(this_01);
      } while (lVar4 != 9);
    }
    uVar1 = (this->tree).super_IndexPointer.data;
    if (uVar1 < 0x100000000000000) {
      (this->tree).super_IndexPointer.data = (idx_t)(this_00->super_Index)._vptr_Index;
      (this_00->super_Index)._vptr_Index = (_func_int **)0x0;
    }
    else {
      bVar2 = Node::MergeInternal(&this->tree,this,(Node *)this_00,(GateStatus)(uVar1 >> 0x3f));
    }
  }
  return bVar2;
}

Assistant:

bool ART::MergeIndexes(IndexLock &state, BoundIndex &other_index) {
	auto &other_art = other_index.Cast<ART>();
	if (!other_art.tree.HasMetadata()) {
		return true;
	}

	if (other_art.owns_data) {
		if (tree.HasMetadata()) {
			// Fully deserialize other_index, and traverse it to increment its buffer IDs.
			unsafe_vector<idx_t> upper_bounds;
			InitializeMerge(upper_bounds);
			other_art.tree.InitMerge(other_art, upper_bounds);
		}

		// Merge the node storage.
		for (idx_t i = 0; i < allocators->size(); i++) {
			(*allocators)[i]->Merge(*(*other_art.allocators)[i]);
		}
	}

	// Merge the ARTs.
	D_ASSERT(tree.GetGateStatus() == other_art.tree.GetGateStatus());
	if (!tree.Merge(*this, other_art.tree, tree.GetGateStatus())) {
		return false;
	}
	return true;
}